

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpnint.h
# Opt level: O0

CTcPrsNode * __thiscall CTPNUnaryBase::fold_constants(CTPNUnaryBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined4 extraout_var;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  CTcPrsNode *ret;
  CTcPrsNode *local_28;
  
  pp_Var2 = in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var2 = (_func_int **)(**(code **)(*pp_Var2 + 0x78))(pp_Var2,in_RSI);
  in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var2;
  iVar1 = (*(in_RDI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x1a])();
  local_28 = in_RDI;
  if ((CTcPrsNode *)CONCAT44(extraout_var,iVar1) != (CTcPrsNode *)0x0) {
    local_28 = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  }
  return local_28;
}

Assistant:

class CTcPrsNode *fold_constants(class CTcPrsSymtab *symtab)
    {
        class CTcPrsNode *ret;
        
        /* fold constants on my subexpression */
        sub_ = sub_->fold_constants(symtab);

        /* try folding the unary operator */
        ret = fold_unop();

        /* 
         *   if we folded the operator, return the result; otherwise,
         *   return the original operator tree for full code generation 
         */
        return (ret != 0 ? ret : this);
    }